

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narpc_storage_client.cc
# Opt level: O2

Future<int> * __thiscall
NarpcStorageClient::WriteData
          (Future<int> *__return_storage_ptr__,NarpcStorageClient *this,int key,longlong address,
          shared_ptr<crail::ByteBuffer> *buf)

{
  int iVar1;
  shared_ptr<NarpcWriteResponse> response;
  shared_ptr<NarpcWriteRequest> request;
  __shared_ptr<NarpcWriteResponse,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<NarpcWriteRequest,_(__gnu_cxx::_Lock_policy)2> local_80;
  int local_6c;
  __shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2> local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2> local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<AsyncTask<int>,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  RpcClient *local_38;
  element_type *local_30;
  
  local_6c = key;
  local_30 = (element_type *)address;
  std::make_shared<NarpcWriteRequest,int&,long_long&,std::shared_ptr<crail::ByteBuffer>&>
            ((int *)&local_80,(longlong *)&local_6c,(shared_ptr<crail::ByteBuffer> *)&local_30);
  local_38 = &this->rpc_client_;
  std::make_shared<NarpcWriteResponse,RpcClient*>((RpcClient **)&local_90);
  std::__shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<NarpcWriteRequest,void>
            (local_58,&local_80);
  std::__shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<NarpcWriteResponse,void>
            (local_68,&local_90);
  iVar1 = RpcClient::IssueRequest
                    (&this->rpc_client_,(shared_ptr<RpcMessage> *)local_58,
                     (shared_ptr<RpcMessage> *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  if (iVar1 < 0) {
    (__return_storage_ptr__->super_AsyncTask<int>)._vptr_AsyncTask = (_func_int **)&PTR_get_0013b398
    ;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->is_done_ = true;
    __return_storage_ptr__->result_ = -1;
  }
  else {
    std::__shared_ptr<AsyncTask<int>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<NarpcWriteResponse,void>(local_48,&local_90);
    Future<int>::Future(__return_storage_ptr__,(shared_ptr<AsyncTask<int>_> *)local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Future<int> NarpcStorageClient::WriteData(int key, long long address,
                                          shared_ptr<ByteBuffer> buf) {
  shared_ptr<NarpcWriteRequest> request =
      make_shared<NarpcWriteRequest>(key, address, buf);
  shared_ptr<NarpcWriteResponse> response =
      make_shared<NarpcWriteResponse>(&rpc_client_);

  if (rpc_client_.IssueRequest(request, response) < 0) {
    return Future<int>::Failure(-1);
  }
  return Future<int>(response);
}